

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::GradientFill::updateContent
          (GradientFill *this,int frameNo,VMatrix *matrix,float alpha)

{
  FillRule rule;
  bool bVar1;
  pointer pVVar2;
  void *in_RDX;
  VBrush *in_RDI;
  float in_XMM0_Da;
  float combinedAlpha;
  int in_stack_0000005c;
  unique_ptr<VGradient,_std::default_delete<VGradient>_> *in_stack_00000060;
  Gradient *in_stack_00000068;
  Gradient *in_stack_ffffffffffffffb0;
  VGradient *gradient;
  VBrush local_30;
  float local_20;
  void *local_18;
  
  local_18 = in_RDX;
  local_20 = internal::model::Gradient::opacity(in_stack_ffffffffffffffb0,(int)in_XMM0_Da);
  local_20 = in_XMM0_Da * local_20;
  internal::model::Gradient::update(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
  pVVar2 = std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::operator->
                     ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x163f58);
  VGradient::setAlpha(pVVar2,local_20);
  pVVar2 = std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::operator->
                     ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x163f81);
  memcpy(&pVVar2->mMatrix,local_18,0x26);
  gradient = (VGradient *)(in_RDI + 2);
  std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::get
            ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x163fb4);
  VBrush::VBrush(in_RDI,gradient);
  VDrawable::setBrush((VDrawable *)gradient,&local_30);
  rule = internal::model::GradientFill::fillRule((GradientFill *)in_RDI[7].field_1.mGradient);
  VDrawable::setFillRule((VDrawable *)(in_RDI + 2),rule);
  bVar1 = vIsZero(0.0);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool renderer::GradientFill::updateContent(int frameNo, const VMatrix &matrix,
                                           float alpha)
{
    float combinedAlpha = alpha * mData->opacity(frameNo);

    mData->update(mGradient, frameNo);
    mGradient->setAlpha(combinedAlpha);
    mGradient->mMatrix = matrix;
    mDrawable.setBrush(VBrush(mGradient.get()));
    mDrawable.setFillRule(mData->fillRule());

    return !vIsZero(combinedAlpha);
}